

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidgetList *
focusPath(QWidgetList *__return_storage_ptr__,QWidget *from,QWidget *to,FocusDirection direction)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  QList<QWidget_*> local_58;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QWidget **)QArrayData::allocate((QArrayData **)&local_58,8,0x10,1,KeepSize);
  *local_58.d.ptr = from;
  local_58.d.size = 1;
  if (from == to) {
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    (__return_storage_ptr__->d).size = 1;
  }
  else {
    do {
      if (direction == Previous) {
        lVar3 = 0x88;
LAB_00310ab4:
        from = *(QWidget **)(*(long *)(*(long *)(*(long *)&from->field_0x8 + 8) + 8) + lVar3);
      }
      else if (direction == Next) {
        lVar3 = 0x80;
        goto LAB_00310ab4;
      }
      if (local_58.d.size != 0) {
        lVar3 = 0;
        do {
          if (local_58.d.size * 8 - lVar3 == 0) goto LAB_00310af4;
          lVar1 = lVar3 + 8;
          plVar2 = (long *)((long)local_58.d.ptr + lVar3);
          lVar3 = lVar1;
        } while ((QWidget *)*plVar2 != from);
        if (lVar1 != 0) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
          (__return_storage_ptr__->d).size = 0;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
            }
          }
          goto LAB_00310b32;
        }
      }
LAB_00310af4:
      local_40 = from;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)&local_58,local_58.d.size,&local_40);
      QList<QWidget_*>::end(&local_58);
    } while (from != to);
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_58.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_58.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_58.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_58.d.ptr._4_4_;
    (__return_storage_ptr__->d).size = local_58.d.size;
  }
LAB_00310b32:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetList focusPath(QWidget *from, QWidget *to, QWidgetPrivate::FocusDirection direction)
{
    QWidgetList path({from});
    if (from == to)
        return path;

    QWidget *current = from;
    do {
        switch (direction) {
        case QWidgetPrivate::FocusDirection::Previous:
            current = current->previousInFocusChain();
            break;
        case QWidgetPrivate::FocusDirection::Next:
            current = current->nextInFocusChain();
            break;
        }
        if (path.contains(current))
            return QWidgetList();
        path << current;
    } while (current != to);

    return path;
}